

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void Commands::Uptime(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arguments,Command_Source *from)

{
  int iVar1;
  undefined4 extraout_var;
  char *this;
  double current_time;
  string buffer;
  long *local_80;
  long local_78;
  long local_70 [2];
  double local_60;
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  this = "Server started ";
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Server started ","");
  iVar1 = (*from->_vptr_Command_Source[4])(from);
  local_60 = *(double *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x80) + 0x98);
  current_time = Timer::GetTime();
  util::timeago_abi_cxx11_(&local_38,(util *)this,local_60,current_time);
  std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_80,local_78 + (long)local_80);
  (*from->_vptr_Command_Source[5])(from,local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

void Uptime(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	std::string buffer = "Server started ";
	buffer += util::timeago(from->SourceWorld()->server->start, Timer::GetTime());
	from->ServerMsg(buffer);
}